

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

extent_t *
arena_extent_alloc_large(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool *zero)

{
  szind_t sVar1;
  extent_t *peVar2;
  undefined4 extraout_var;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t usize_00;
  size_t usize_01;
  ulong uVar3;
  _Bool commit;
  ulong local_50;
  extent_hooks_t *extent_hooks;
  ulong local_40;
  tsdn_t *local_38;
  
  extent_hooks = (extent_hooks_t *)0x0;
  if (usize < 0x1001) {
    local_40 = (ulong)sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    sVar1 = sz_size2index_compute(usize);
    local_40 = CONCAT44(extraout_var,sVar1);
  }
  commit = true;
  peVar2 = extents_alloc(tsdn,arena,&extent_hooks,&arena->extents_dirty,(void *)0x0,usize,0x1000,
                         alignment,false,(szind_t)local_40,zero,&commit);
  usize_01 = extraout_RDX;
  if (peVar2 == (extent_t *)0x0) {
    if ((arena->decay_muzzy).time_ms.repr != 0) {
      local_38 = tsdn;
      peVar2 = extents_alloc(tsdn,arena,&extent_hooks,&arena->extents_muzzy,(void *)0x0,usize,0x1000
                             ,alignment,false,(szind_t)local_40,zero,&commit);
      local_50 = usize + 0x1000;
      usize_01 = extraout_RDX_00;
      tsdn = local_38;
      if (peVar2 != (extent_t *)0x0) goto LAB_001164a8;
    }
    local_50 = usize + 0x1000;
    peVar2 = extent_alloc_wrapper
                       (tsdn,arena,&extent_hooks,(void *)0x0,usize,0x1000,alignment,false,
                        (szind_t)local_40,zero,&commit);
    if (peVar2 == (extent_t *)0x0) {
      return (extent_t *)0x0;
    }
    arena_large_malloc_stats_update((tsdn_t *)arena,(arena_t *)usize,usize_00);
    if (local_50 == 0) {
      uVar3 = 0;
    }
    else {
      LOCK();
      (arena->stats).mapped.repr = (arena->stats).mapped.repr + local_50;
      UNLOCK();
      uVar3 = local_50;
    }
  }
  else {
LAB_001164a8:
    uVar3 = usize + 0x1000;
    arena_large_malloc_stats_update((tsdn_t *)arena,(arena_t *)usize,usize_01);
  }
  LOCK();
  (arena->nactive).repr = (arena->nactive).repr + (uVar3 >> 0xc);
  UNLOCK();
  return peVar2;
}

Assistant:

extent_t *
arena_extent_alloc_large(tsdn_t *tsdn, arena_t *arena, size_t usize,
    size_t alignment, bool *zero) {
	extent_hooks_t *extent_hooks = EXTENT_HOOKS_INITIALIZER;

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	szind_t szind = sz_size2index(usize);
	size_t mapped_add;
	bool commit = true;
	extent_t *extent = extents_alloc(tsdn, arena, &extent_hooks,
	    &arena->extents_dirty, NULL, usize, sz_large_pad, alignment, false,
	    szind, zero, &commit);
	if (extent == NULL && arena_may_have_muzzy(arena)) {
		extent = extents_alloc(tsdn, arena, &extent_hooks,
		    &arena->extents_muzzy, NULL, usize, sz_large_pad, alignment,
		    false, szind, zero, &commit);
	}
	size_t size = usize + sz_large_pad;
	if (extent == NULL) {
		extent = extent_alloc_wrapper(tsdn, arena, &extent_hooks, NULL,
		    usize, sz_large_pad, alignment, false, szind, zero,
		    &commit);
		if (config_stats) {
			/*
			 * extent may be NULL on OOM, but in that case
			 * mapped_add isn't used below, so there's no need to
			 * conditionlly set it to 0 here.
			 */
			mapped_add = size;
		}
	} else if (config_stats) {
		mapped_add = 0;
	}

	if (extent != NULL) {
		if (config_stats) {
			arena_stats_lock(tsdn, &arena->stats);
			arena_large_malloc_stats_update(tsdn, arena, usize);
			if (mapped_add != 0) {
				arena_stats_add_zu(tsdn, &arena->stats,
				    &arena->stats.mapped, mapped_add);
			}
			arena_stats_unlock(tsdn, &arena->stats);
		}
		arena_nactive_add(arena, size >> LG_PAGE);
	}

	return extent;
}